

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-mock-test.cc
# Opt level: O2

void __thiscall
BufferedFileTest_CloseNoRetryInDtor_Test::TestBody(BufferedFileTest_CloseNoRetryInDtor_Test *this)

{
  bool bVar1;
  buffered_file *this_00;
  AssertionResult *pAVar2;
  char *pcVar3;
  string_view message;
  file read_end;
  int saved_fclose_count;
  file write_end;
  AssertionResult gtest_ar;
  string gtest_output;
  scoped_ptr<fmt::v5::buffered_file> f;
  string gtest_expected_output;
  OutputRedirect gtest_redir;
  
  read_end.fd_ = -1;
  write_end.fd_ = -1;
  fmt::v5::file::pipe(&read_end,&write_end.fd_);
  this_00 = (buffered_file *)operator_new(8);
  fmt::v5::file::fdopen((file *)this_00,(int)&read_end,"r");
  saved_fclose_count = 0;
  f.ptr_ = this_00;
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    message.size_ = 0x11;
    message.data_ = "cannot close file";
    format_system_error_abi_cxx11_(&gtest_output,4,message);
    std::operator+(&gtest_expected_output,&gtest_output,"\n");
    std::__cxx11::string::~string((string *)&gtest_output);
    OutputRedirect::OutputRedirect(&gtest_redir,_stderr);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (anonymous_namespace)::fclose_count = 1;
      testing::internal::scoped_ptr<fmt::v5::buffered_file>::reset(&f,(buffered_file *)0x0);
      saved_fclose_count = (anonymous_namespace)::fclose_count;
      (anonymous_namespace)::fclose_count = 0;
    }
    OutputRedirect::restore_and_read_abi_cxx11_(&gtest_output,&gtest_redir);
    bVar1 = std::operator!=(&gtest_output,&gtest_expected_output);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&gtest_output);
      OutputRedirect::~OutputRedirect(&gtest_redir);
      std::__cxx11::string::~string((string *)&gtest_expected_output);
      goto LAB_001103e7;
    }
    pAVar2 = testing::AssertionResult::operator<<
                       (&gtest_ar,
                        (char (*) [121])
                        "{ fclose_count = 1; f.reset(nullptr); saved_fclose_count = fclose_count; fclose_count = 0; } produces different output.\n"
                       );
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x14aa35);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&gtest_expected_output);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x14b100);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x14aa29);
    testing::AssertionResult::operator<<(pAVar2,&gtest_output);
    std::__cxx11::string::~string((string *)&gtest_output);
    OutputRedirect::~OutputRedirect(&gtest_redir);
    std::__cxx11::string::~string((string *)&gtest_expected_output);
  }
  testing::Message::Message((Message *)&gtest_expected_output);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_output,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-mock-test.cc"
             ,0x198,pcVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&gtest_output,(Message *)&gtest_expected_output);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_output);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_output);
LAB_001103e7:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_output._M_dataplus._M_p._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_expected_output,"2","saved_fclose_count",(int *)&gtest_output,
             &saved_fclose_count);
  if ((char)gtest_expected_output._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_output);
    if (gtest_expected_output._M_string_length == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_expected_output._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-mock-test.cc"
               ,0x199,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_output);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_output);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_expected_output._M_string_length);
  testing::internal::scoped_ptr<fmt::v5::buffered_file>::~scoped_ptr(&f);
  fmt::v5::file::~file(&write_end);
  fmt::v5::file::~file(&read_end);
  return;
}

Assistant:

TEST(BufferedFileTest, CloseNoRetryInDtor) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  scoped_ptr<buffered_file> f(new buffered_file(read_end.fdopen("r")));
  int saved_fclose_count = 0;
  EXPECT_WRITE(stderr, {
    fclose_count = 1;
    f.reset(FMT_NULL);
    saved_fclose_count = fclose_count;
    fclose_count = 0;
  }, format_system_error(EINTR, "cannot close file") + "\n");
  EXPECT_EQ(2, saved_fclose_count);
}